

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_dns.c
# Opt level: O2

void PrintOutput(void *mem,sunrealtype t,N_Vector y)

{
  undefined8 *puVar1;
  int kused;
  sunrealtype local_50;
  int retval;
  sunrealtype hused;
  long nst;
  
  local_50 = t;
  puVar1 = (undefined8 *)N_VGetArrayPointer(y);
  retval = IDAGetLastOrder(mem,&kused);
  check_retval(&retval,"IDAGetLastOrder",1);
  retval = IDAGetNumSteps(mem,&nst);
  check_retval(&retval,"IDAGetNumSteps",1);
  retval = IDAGetLastStep(mem,&hused);
  check_retval(&retval,"IDAGetLastStep",1);
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n",local_50,*puVar1,puVar1[1],puVar1[2],
         hused,nst,(ulong)(uint)kused);
  return;
}

Assistant:

static void PrintOutput(void* mem, sunrealtype t, N_Vector y)
{
  sunrealtype* yval;
  int retval, kused;
  long int nst;
  sunrealtype hused;

  yval = N_VGetArrayPointer(y);

  retval = IDAGetLastOrder(mem, &kused);
  check_retval(&retval, "IDAGetLastOrder", 1);
  retval = IDAGetNumSteps(mem, &nst);
  check_retval(&retval, "IDAGetNumSteps", 1);
  retval = IDAGetLastStep(mem, &hused);
  check_retval(&retval, "IDAGetLastStep", 1);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("%5.2Lf %12.4Le %12.4Le %12.4Le | %3ld  %1d %12.4Le\n", t, yval[0],
         yval[1], yval[2], nst, kused, hused);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#else
  printf("%5.2f %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n", t, yval[0], yval[1],
         yval[2], nst, kused, hused);
#endif
}